

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_OverlappingExtensionRanges_Test::
~ValidationErrorTest_OverlappingExtensionRanges_Test
          (ValidationErrorTest_OverlappingExtensionRanges_Test *this)

{
  ValidationErrorTest_OverlappingExtensionRanges_Test *this_local;
  
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, OverlappingExtensionRanges) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "message_type {"
      "  name: \"Foo\""
      "  extension_range { start: 10 end: 20 }"
      "  extension_range { start: 20 end: 30 }"
      "  extension_range { start: 19 end: 21 }"
      "}",

      "foo.proto: Foo: NUMBER: Extension range 19 to 20 overlaps with "
      "already-defined range 10 to 19.\n"
      "foo.proto: Foo: NUMBER: Extension range 19 to 20 overlaps with "
      "already-defined range 20 to 29.\n");
}